

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal.cpp
# Opt level: O0

int Initialize(void)

{
  bool bVar1;
  FILE *__stream;
  bool bVar2;
  int iVar3;
  uint uVar4;
  BOOL BVar5;
  DWORD DVar6;
  _CRITICAL_SECTION *p_Var7;
  CSharedMemoryObjectManager *this;
  int local_4c [3];
  undefined1 auStack_40 [4];
  int err;
  rlimit rl;
  rlim_t maxStackSize;
  bool fFirstTimeInit;
  int retval;
  CSharedMemoryObjectManager *pshmom;
  CPalThread *pThread;
  PAL_ERROR palError;
  
  pThread._4_4_ = 0x1f;
  pshmom = (CSharedMemoryObjectManager *)0x0;
  maxStackSize._4_4_ = -1;
  bVar1 = false;
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  SetLastError(0x1f);
  rl.rlim_max = 0x800000;
  local_4c[2] = getrlimit64(RLIMIT_STACK,(rlimit64 *)auStack_40);
  if ((local_4c[2] == 0) && (0x800000 < _auStack_40)) {
    _auStack_40 = 0x800000;
    local_4c[2] = setrlimit64(RLIMIT_STACK,(rlimit64 *)auStack_40);
    if (local_4c[2] != 0) {
      fprintf(_stderr,"ASSERTION (%s, line %d) %s %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/init/pal.cpp"
              ,0x97,
              "err == 0 && \"Well, the environment has a strange stack limit               and setrlimit call failed to fix that\""
              ,"");
      fflush(_stderr);
      abort();
    }
    local_4c[2] = 0;
  }
  CorUnix::CriticalSectionSubSysInitialize();
  if (init_critsec == (PCRITICAL_SECTION)0x0) {
    pthread_mutex_lock((pthread_mutex_t *)&init_critsec_mutex);
    if (init_critsec == (PCRITICAL_SECTION)0x0) {
      CorUnix::InternalInitializeCriticalSectionAndSpinCount(&Initialize::temp_critsec,0,false);
      p_Var7 = InterlockedCompareExchangePointerT<_CRITICAL_SECTION>
                         (&init_critsec,&Initialize::temp_critsec,0);
      if (p_Var7 != (_CRITICAL_SECTION *)0x0) {
        if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
          abort();
        }
        InternalDeleteCriticalSection(&Initialize::temp_critsec);
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)&init_critsec_mutex);
  }
  CorUnix::InternalEnterCriticalSection((CPalThread *)pshmom,init_critsec);
  local_4c[1] = 0;
  bVar2 = Volatile<int>::operator==(&init_count,local_4c + 1);
  if (bVar2) {
    gPID = getpid();
    bVar1 = true;
    BVar5 = TLSInitialize();
    if (((BVar5 == 0) || (BVar5 = MiscInitialize(), BVar5 == 0)) ||
       (BVar5 = DBG_init_channels(), BVar5 == 0)) goto LAB_00237f79;
    iVar3 = getpagesize();
    if (iVar3 != 0x1000) {
      fprintf(_stderr,"] %s %s:%d","Initialize",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/init/pal.cpp"
              ,0xd6);
      __stream = _stderr;
      uVar4 = getpagesize();
      fprintf(__stream,
              "VIRTUAL_PAGE_SIZE is incorrect for this system!\nChange include/pal/virtual.h and clr/src/inc/stdmacros.h to reflect the correct page size of %d.\n"
              ,(ulong)uVar4);
    }
    BVar5 = SHMInitialize();
    if (BVar5 != 0) {
      pThread._4_4_ = CorUnix::InitializeProcessData();
      if (pThread._4_4_ == 0) {
        pThread._4_4_ = CorUnix::CreateThreadData((CPalThread **)&pshmom);
        if (pThread._4_4_ == 0) {
          CorUnix::PROCAddThread((CPalThread *)pshmom,(CPalThread *)pshmom);
          g_fThreadDataAvailable = 1;
          BVar5 = LOADInitializeModules();
          if (BVar5 == 0) {
            if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
              abort();
            }
            pThread._4_4_ = 0x54f;
          }
          else {
            this = CorUnix::InternalNew<CorUnix::CSharedMemoryObjectManager>();
            if (this == (CSharedMemoryObjectManager *)0x0) {
              if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
                abort();
              }
              pThread._4_4_ = 0xe;
            }
            else {
              pThread._4_4_ = CorUnix::CSharedMemoryObjectManager::Initialize(this);
              if (pThread._4_4_ == 0) {
                CorUnix::g_pObjectManager = this;
                CorUnix::g_pSynchronizationManager =
                     CorUnix::CPalSynchMgrController::CreatePalSynchronizationManager();
                if (CorUnix::g_pSynchronizationManager != (IPalSynchronizationManager *)0x0)
                goto LAB_00237ddb;
                pThread._4_4_ = 8;
                if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
                  abort();
                }
              }
              else {
                if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
                  abort();
                }
                CorUnix::InternalDelete<CorUnix::CSharedMemoryObjectManager>(this);
              }
            }
          }
        }
        else if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
          abort();
        }
      }
      else if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      goto LAB_00237f5b;
    }
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
  }
  else {
    pshmom = (CSharedMemoryObjectManager *)CorUnix::InternalGetCurrentThread();
LAB_00237ddb:
    pThread._4_4_ = 0x1f;
    local_4c[0] = 0;
    bVar2 = Volatile<int>::operator==(&init_count,local_4c);
    if (!bVar2) {
      Volatile<int>::operator++(&init_count,0);
      PAL_Enter(PAL_BoundaryTop);
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      Volatile<int>::Load(&init_count);
      SetLastError(0);
LAB_00237f3b:
      maxStackSize._4_4_ = 0;
      goto LAB_00237f79;
    }
    pThread._4_4_ = CorUnix::CreateInitialProcessAndThreadObjects((CPalThread *)pshmom);
    if (pThread._4_4_ == 0) {
      BVar5 = SEHInitializeSignals();
      if (BVar5 != 0) {
        pThread._4_4_ = 0x1f;
        BVar5 = TIMEInitialize();
        if (BVar5 == 0) {
          if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
            abort();
          }
        }
        else {
          BVar5 = MAPInitialize();
          if (BVar5 == 0) {
            if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
              abort();
            }
          }
          else {
            BVar5 = FILEInitStdHandles();
            if (BVar5 == 0) {
              if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
                abort();
              }
            }
            else {
              BVar5 = CRTInitStdStreams();
              if (BVar5 != 0) {
                if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
                  abort();
                }
                Volatile<int>::operator++(&init_count,0);
                SetLastError(0);
                goto LAB_00237f3b;
              }
              if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
                abort();
              }
              FILECleanupStdHandles();
            }
            VIRTUALCleanup();
            MAPCleanup();
          }
        }
      }
    }
    else if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    PROCCleanupInitialProcess();
LAB_00237f5b:
    SHMCleanup();
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  SetLastError(pThread._4_4_);
LAB_00237f79:
  CorUnix::InternalLeaveCriticalSection((CPalThread *)pshmom,init_critsec);
  if (((bVar1) && (maxStackSize._4_4_ == 0)) && (pshmom == (CSharedMemoryObjectManager *)0x0)) {
    fprintf(_stderr,"ASSERTION (%s, line %d) %s %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/init/pal.cpp"
            ,0x1a7,"__null != pThread","");
    fflush(_stderr);
    abort();
  }
  if ((maxStackSize._4_4_ != 0) && (DVar6 = GetLastError(), DVar6 == 0)) {
    fprintf(_stderr,"] %s %s:%d","Initialize",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/init/pal.cpp"
            ,0x1ac);
    fprintf(_stderr,"returning failure, but last error not set\n");
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
    return maxStackSize._4_4_;
  }
  abort();
}

Assistant:

static int
Initialize()
{
    PAL_ERROR palError = ERROR_GEN_FAILURE;
    CPalThread *pThread = NULL;
    CSharedMemoryObjectManager *pshmom = NULL;
    int retval = -1;
    bool fFirstTimeInit = false;

    /* the first ENTRY within the first call to PAL_Initialize is a special
       case, since debug channels are not initialized yet. So in that case the
       ENTRY will be called after the DBG channels initialization */
    ENTRY_EXTERNAL("PAL_Initialize()\n");

    /*Firstly initiate a lastError */
    SetLastError(ERROR_GEN_FAILURE);

    // prevent un-reasonable stack limits. (otherwise affects mmap calls later)
#if !defined(__IOS__) && !defined(__ANDROID__)
#if defined (_AMD64_) || defined (_M_ARM64)
    const rlim_t maxStackSize = 8 * 1024 * 1024;   // CC Max stack size
#else
    const rlim_t maxStackSize = 2 * 1024 * 1024;   // CC Max stack size
#endif
    struct rlimit rl;
    int err = getrlimit(RLIMIT_STACK, &rl);
    if (!err)
    {
        if (rl.rlim_cur > maxStackSize)
        {
            rl.rlim_cur = maxStackSize;
            err = setrlimit(RLIMIT_STACK, &rl);
            _ASSERTE(err == 0 && "Well, the environment has a strange stack limit \
              and setrlimit call failed to fix that");
        }
    }
#endif // !__IOS__ && !__ANDROID__
    CriticalSectionSubSysInitialize();

    if(NULL == init_critsec)
    {
        pthread_mutex_lock(&init_critsec_mutex); // prevents race condition of two threads
                                                 // initializing the critical section.
        if(NULL == init_critsec)
        {
            static CRITICAL_SECTION temp_critsec;

            // Want this critical section to NOT be internal to avoid the use of unsafe region markers.
            InternalInitializeCriticalSectionAndSpinCount(&temp_critsec, 0, false);

            if(NULL != InterlockedCompareExchangePointer(&init_critsec, &temp_critsec, NULL))
            {
                // Another thread got in before us! shouldn't happen, if the PAL
                // isn't initialized there shouldn't be any other threads
                WARN("Another thread initialized the critical section\n");
                InternalDeleteCriticalSection(&temp_critsec);
            }
        }
        pthread_mutex_unlock(&init_critsec_mutex);
    }

    InternalEnterCriticalSection(pThread, init_critsec); // here pThread is always NULL

    if (init_count == 0)
    {
        // Set our pid.
        gPID = getpid();

        fFirstTimeInit = true;

        // Initialize the TLS lookaside cache
        if (FALSE == TLSInitialize())
        {
            goto done;
        }

        // Initialize the environment.
        if (FALSE == MiscInitialize())
        {
            goto done;
        }

        // Initialize debug channel settings before anything else.
        // This depends on the environment, so it must come after
        // MiscInitialize.
        if (FALSE == DBG_init_channels())
        {
            goto done;
        }
#if _DEBUG
        // Verify that our page size is what we think it is. If it's
        // different, we can't run.
        if (VIRTUAL_PAGE_SIZE != getpagesize())
        {
            ASSERT("VIRTUAL_PAGE_SIZE is incorrect for this system!\n"
                "Change include/pal/virtual.h and clr/src/inc/stdmacros.h "
                "to reflect the correct page size of %d.\n", getpagesize());
        }
#endif  // _DEBUG

        /* initialize the shared memory infrastructure */
        if (!SHMInitialize())
        {
            ERROR("Shared memory initialization failed!\n");
            goto CLEANUP0;
        }

        //
        // Initialize global process data
        //
        palError = InitializeProcessData();
        if (NO_ERROR != palError)
        {
            ERROR("Unable to initialize process data\n");
            goto CLEANUP1;
        }

#if HAVE_MACH_EXCEPTIONS
        // Mach exception port needs to be set up before the thread
        // data or threads are set up.
        if (!SEHInitializeMachExceptions())
        {
            ERROR("SEHInitializeMachExceptions failed!\n");
            palError = ERROR_GEN_FAILURE;
            goto CLEANUP1;
        }
#endif // HAVE_MACH_EXCEPTIONS

        //
        // Allocate the initial thread data
        //

        palError = CreateThreadData(&pThread);
        if (NO_ERROR != palError)
        {
            ERROR("Unable to create initial thread data\n");
            goto CLEANUP1a;
        }
        PROCAddThread(pThread, pThread);

        //
        // It's now safe to access our thread data
        //
        g_fThreadDataAvailable = TRUE;

        //
        // Initialize module manager
        //
        if (FALSE == LOADInitializeModules())
        {
            ERROR("Unable to initialize module manager\n");
            palError = ERROR_INTERNAL_ERROR;
            goto CLEANUP1b;
        }

        //
        // Initialize the object manager
        //
        pshmom = InternalNew<CSharedMemoryObjectManager>();
        if (NULL == pshmom)
        {
            ERROR("Unable to allocate new object manager\n");
            palError = ERROR_OUTOFMEMORY;
            goto CLEANUP1b;
        }

        palError = pshmom->Initialize();
        if (NO_ERROR != palError)
        {
            ERROR("object manager initialization failed!\n");
            InternalDelete(pshmom);
            goto CLEANUP1b;
        }

        g_pObjectManager = pshmom;

        //
        // Initialize the synchronization manager
        //
        g_pSynchronizationManager =
            CPalSynchMgrController::CreatePalSynchronizationManager();

        if (NULL == g_pSynchronizationManager)
        {
            palError = ERROR_NOT_ENOUGH_MEMORY;
            ERROR("Failure creating synchronization manager\n");
            goto CLEANUP1c;
        }
    }
    else
    {
        pThread = InternalGetCurrentThread();
    }

    palError = ERROR_GEN_FAILURE;

    if (init_count == 0)
    {
        //
        // Create the initial process and thread objects
        //
        palError = CreateInitialProcessAndThreadObjects(pThread);
        if (NO_ERROR != palError)
        {
            ERROR("Unable to create initial process and thread objects\n");
            goto CLEANUP5;
        }

#if !HAVE_MACH_EXCEPTIONS
        if(!SEHInitializeSignals())
        {
            goto CLEANUP5;
        }
#endif

        palError = ERROR_GEN_FAILURE;

        if (FALSE == TIMEInitialize())
        {
            ERROR("Unable to initialize TIME support\n");
            goto CLEANUP6;
        }

        /* Initialize the File mapping critical section. */
        if (FALSE == MAPInitialize())
        {
            ERROR("Unable to initialize file mapping support\n");
            goto CLEANUP6;
        }

        /* create file objects for standard handles */
        if(!FILEInitStdHandles())
        {
            ERROR("Unable to initialize standard file handles\n");
            goto CLEANUP13;
        }

        if (FALSE == CRTInitStdStreams())
        {
            ERROR("Unable to initialize CRT standard streams\n");
            goto CLEANUP15;
        }

        TRACE("First-time PAL initialization complete.\n");
        init_count++;

        /* Set LastError to a non-good value - functions within the
           PAL startup may set lasterror to a nonzero value. */
        SetLastError(NO_ERROR);
        retval = 0;
    }
    else
    {
        init_count++;

        // Behave the same wrt entering the PAL independent of whether this
        // is the first call to PAL_Initialize or not.  The first call implied
        // PAL_Enter by virtue of creating the CPalThread for the current
        // thread, and its starting state is to be in the PAL.
        (void)PAL_Enter(PAL_BoundaryTop);

        TRACE("Initialization count increases to %d\n", init_count.Load());

        SetLastError(NO_ERROR);
        retval = 0;
    }
    goto done;

    /* No cleanup required for CRTInitStdStreams */
CLEANUP15:
    FILECleanupStdHandles();
CLEANUP13:
    VIRTUALCleanup();
    MAPCleanup();
CLEANUP6:
CLEANUP5:
    PROCCleanupInitialProcess();
CLEANUP1d:
    // Cleanup synchronization manager
CLEANUP1c:
    // Cleanup object manager
CLEANUP1b:
    // Cleanup initial thread data
CLEANUP1a:
    // Cleanup global process data
CLEANUP1:
    SHMCleanup();
CLEANUP0:
    ERROR("PAL_Initialize failed\n");
    SetLastError(palError);

done:
#ifdef PAL_PERF
    if( retval == 0)
    {
         PERFEnableProcessProfile();
         PERFEnableThreadProfile(FALSE);
         PERFCalibrate("Overhead of PERF entry/exit");
    }
#endif

    InternalLeaveCriticalSection(pThread, init_critsec);

    if (fFirstTimeInit && 0 == retval)
    {
        _ASSERTE(NULL != pThread);
    }

    if (retval != 0 && GetLastError() == ERROR_SUCCESS)
    {
        ASSERT("returning failure, but last error not set\n");
    }

    LOGEXIT("PAL_Initialize returns int %d\n", retval);
    return retval;
}